

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

void cp_decl_multi(CPState *cp)

{
  int iVar1;
  CPToken CVar2;
  CTypeID CVar3;
  CType *pCStack_aa8;
  CTypeID aid;
  CType *cta;
  CType *pCStack_a98;
  CTypeID id;
  CType *ct;
  uint local_a88;
  CTypeID ctypeid;
  CTInfo info;
  CPToken tok;
  BCLine hashline;
  CPscl scl;
  CPDecl decl;
  int first;
  CPState *cp_local;
  
  decl.stack[99].name.gcptr64._4_4_ = 1;
  while( true ) {
    while( true ) {
      while( true ) {
        if (cp->tok == 0x103) {
          return;
        }
        iVar1 = cp_opt(cp,0x3b);
        if (iVar1 == 0) break;
        decl.stack[99].name.gcptr64._4_4_ = 0;
      }
      if (cp->tok != 0x23) break;
      info = cp->linenumber;
      ctypeid = cp_next(cp);
      if (ctypeid == 0x102) {
        cp_line(cp,info);
      }
      else if (((ctypeid == 0x100) && (cp->str->len == 4)) &&
              ((int)cp->str[1].nextgc.gcptr64 == 0x656e696c)) {
        CVar2 = cp_next(cp);
        if (CVar2 != 0x102) {
          cp_err_token(cp,ctypeid);
        }
        cp_line(cp,info);
      }
      else {
        if (((ctypeid != 0x100) || (cp->str->len != 6)) ||
           (iVar1 = memcmp(cp->str + 1,"pragma",6), iVar1 != 0)) {
          cp_errmsg(cp,cp->tok,LJ_ERR_XSYMBOL);
        }
        cp_pragma(cp,info);
      }
    }
    tok = cp_decl_spec(cp,(CPDecl *)&hashline,0x38000);
    if (((cp->tok != 0x3b) && (cp->tok != 0x103)) || (decl.specfattr >> 0x1c != 7)) break;
    cp_local = (CPState *)&decl.specfattr;
    do {
      cp_local = (CPState *)(cp->cts->tab + (cp_local->c & 0xffff));
    } while ((uint)cp_local->c >> 0x1c == 8);
    local_a88 = cp_local->c;
    if ((local_a88 >> 0x1c != 1) && (local_a88 >> 0x1c != 5)) break;
LAB_001889f6:
    if ((cp->tok == 0x103) && (decl.stack[99].name.gcptr64._4_4_ != 0)) {
      return;
    }
    decl.stack[99].name.gcptr64._4_4_ = 0;
    cp_check(cp,0x3b);
  }
  do {
    cp_declarator(cp,(CPDecl *)&hashline);
    ct._4_4_ = cp_decl_intern(cp,(CPDecl *)&hashline);
    if ((decl.cp != (CPState *)0x0) && ((int)decl.redir == 0)) {
      if ((tok & 0x8000U) == 0) {
        if (cp->cts->tab[ct._4_4_].info >> 0x1c == 6) {
          pCStack_a98 = cp->cts->tab + ct._4_4_;
          cta._4_4_ = ct._4_4_;
        }
        else {
          if ((tok & 0x20000U) != 0) {
            cta._4_4_ = cp_decl_constinit(cp,&stack0xfffffffffffff568,ct._4_4_);
            goto LAB_0018897e;
          }
          cta._4_4_ = lj_ctype_new(cp->cts,&stack0xfffffffffffff568);
          pCStack_a98->info = ct._4_4_ + 0xc0000000;
        }
        if (decl.name != (GCstr *)0x0) {
          CVar3 = lj_ctype_new(cp->cts,&stack0xfffffffffffff558);
          pCStack_a98 = cp->cts->tab + cta._4_4_;
          pCStack_aa8->info = 0x80040000;
          pCStack_aa8->sib = pCStack_a98->sib;
          pCStack_a98->sib = (CTypeID1)CVar3;
          (decl.name)->marked = (decl.name)->marked | 0x20;
          (pCStack_aa8->name).gcptr64 = (uint64_t)decl.name;
        }
      }
      else {
        cta._4_4_ = lj_ctype_new(cp->cts,&stack0xfffffffffffff568);
        pCStack_a98->info = ct._4_4_ + 0x70000000;
      }
LAB_0018897e:
      *(byte *)&((decl.cp)->val).field_0 = *(byte *)&((decl.cp)->val).field_0 | 0x20;
      (pCStack_a98->name).gcptr64 = (uint64_t)decl.cp;
      lj_ctype_addname(cp->cts,pCStack_a98,cta._4_4_);
    }
    iVar1 = cp_opt(cp,0x2c);
    if (iVar1 == 0) goto LAB_001889f6;
    cp_decl_reset((CPDecl *)&hashline);
  } while( true );
}

Assistant:

static void cp_decl_multi(CPState *cp)
{
  int first = 1;
  while (cp->tok != CTOK_EOF) {
    CPDecl decl;
    CPscl scl;
    if (cp_opt(cp, ';')) {  /* Skip empty statements. */
      first = 0;
      continue;
    }
    if (cp->tok == '#') {  /* Workaround, since we have no preprocessor, yet. */
      BCLine hashline = cp->linenumber;
      CPToken tok = cp_next(cp);
      if (tok == CTOK_INTEGER) {
	cp_line(cp, hashline);
	continue;
      } else if (tok == CTOK_IDENT && cp_str_is(cp->str, "line")) {
	if (cp_next(cp) != CTOK_INTEGER) cp_err_token(cp, tok);
	cp_line(cp, hashline);
	continue;
      } else if (tok == CTOK_IDENT && cp_str_is(cp->str, "pragma")) {
	cp_pragma(cp, hashline);
	continue;
      } else {
	cp_errmsg(cp, cp->tok, LJ_ERR_XSYMBOL);
      }
    }
    scl = cp_decl_spec(cp, &decl, CDF_TYPEDEF|CDF_EXTERN|CDF_STATIC);
    if ((cp->tok == ';' || cp->tok == CTOK_EOF) &&
	ctype_istypedef(decl.stack[0].info)) {
      CTInfo info = ctype_rawchild(cp->cts, &decl.stack[0])->info;
      if (ctype_isstruct(info) || ctype_isenum(info))
	goto decl_end;  /* Accept empty declaration of struct/union/enum. */
    }
    for (;;) {
      CTypeID ctypeid;
      cp_declarator(cp, &decl);
      ctypeid = cp_decl_intern(cp, &decl);
      if (decl.name && !decl.nameid) {  /* NYI: redeclarations are ignored. */
	CType *ct;
	CTypeID id;
	if ((scl & CDF_TYPEDEF)) {  /* Create new typedef. */
	  id = lj_ctype_new(cp->cts, &ct);
	  ct->info = CTINFO(CT_TYPEDEF, ctypeid);
	  goto noredir;
	} else if (ctype_isfunc(ctype_get(cp->cts, ctypeid)->info)) {
	  /* Treat both static and extern function declarations as extern. */
	  ct = ctype_get(cp->cts, ctypeid);
	  /* We always get new anonymous functions (typedefs are copied). */
	  lj_assertCP(gcref(ct->name) == NULL, "unexpected named function");
	  id = ctypeid;  /* Just name it. */
	} else if ((scl & CDF_STATIC)) {  /* Accept static constants. */
	  id = cp_decl_constinit(cp, &ct, ctypeid);
	  goto noredir;
	} else {  /* External references have extern or no storage class. */
	  id = lj_ctype_new(cp->cts, &ct);
	  ct->info = CTINFO(CT_EXTERN, ctypeid);
	}
	if (decl.redir) {  /* Add attribute for redirected symbol name. */
	  CType *cta;
	  CTypeID aid = lj_ctype_new(cp->cts, &cta);
	  ct = ctype_get(cp->cts, id);  /* Table may have been reallocated. */
	  cta->info = CTINFO(CT_ATTRIB, CTATTRIB(CTA_REDIR));
	  cta->sib = ct->sib;
	  ct->sib = aid;
	  ctype_setname(cta, decl.redir);
	}
      noredir:
	ctype_setname(ct, decl.name);
	lj_ctype_addname(cp->cts, ct, id);
      }
      if (!cp_opt(cp, ',')) break;
      cp_decl_reset(&decl);
    }
  decl_end:
    if (cp->tok == CTOK_EOF && first) break;  /* May omit ';' for 1 decl. */
    first = 0;
    cp_check(cp, ';');
  }
}